

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_SAX2(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  size_t sVar12;
  xmlChar *pxVar13;
  xmlEntityPtr pxVar14;
  ulong uVar15;
  xmlChar *pxVar16;
  int iVar17;
  bool bVar18;
  int n_ctx_8;
  ulong uVar19;
  ulong uVar20;
  xmlChar *in_RSI;
  ulong uVar21;
  int test_ret_3;
  int n_ctx;
  int local_9c;
  uint local_98;
  int local_94;
  int local_80;
  int test_ret_4;
  int local_78;
  int test_ret_5;
  int test_ret_1;
  int test_ret;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  uint local_44;
  uint local_40;
  uint local_3c;
  int test_ret_2;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing SAX2 : 38 of 38 functions ...");
  }
  iVar1 = xmlMemBlocks();
  docbDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    in_RSI = (xmlChar *)(ulong)(uint)(iVar3 - iVar1);
    printf("Leak of %d blocks found in docbDefaultSAXHandlerInit");
    putchar(10);
  }
  local_3c = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  htmlDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    in_RSI = (xmlChar *)(ulong)(uint)(iVar3 - iVar1);
    printf("Leak of %d blocks found in htmlDefaultSAXHandlerInit");
    putchar(10);
  }
  local_40 = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  xmlDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    in_RSI = (xmlChar *)(ulong)(uint)(iVar3 - iVar1);
    printf("Leak of %d blocks found in xmlDefaultSAXHandlerInit");
    putchar(10);
  }
  local_44 = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  local_98 = 0;
  for (uVar15 = 0; (int)uVar15 != 2; uVar15 = (ulong)((int)uVar15 + 1)) {
    uVar19 = 0;
    while (iVar1 = (int)uVar19, iVar1 != 5) {
      uVar21 = 0;
      while (iVar2 = (int)uVar21, iVar2 != 5) {
        uVar20 = 0;
        while (iVar3 = (int)uVar20, iVar3 != 4) {
          for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
            for (iVar17 = 0; iVar17 != 5; iVar17 = iVar17 + 1) {
              bVar18 = true;
              while (iVar7 = (int)in_RSI, bVar18) {
                iVar4 = xmlMemBlocks();
                in_RSI = gen_const_xmlChar_ptr(iVar1,iVar7);
                pxVar10 = gen_const_xmlChar_ptr(iVar2,iVar7);
                iVar5 = gen_int(iVar3,iVar7);
                iVar6 = gen_int(uVar8,iVar7);
                pxVar11 = gen_const_xmlChar_ptr(iVar17,iVar7);
                xmlSAX2AttributeDecl(0,in_RSI,pxVar10,iVar5,iVar6,pxVar11,0);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar7 = xmlMemBlocks();
                if (iVar4 == iVar7) break;
                iVar7 = xmlMemBlocks();
                bVar18 = false;
                printf("Leak of %d blocks found in xmlSAX2AttributeDecl",
                       (ulong)(uint)(iVar7 - iVar4));
                local_98 = local_98 + 1;
                printf(" %d",uVar15);
                printf(" %d",uVar19);
                printf(" %d",uVar21);
                printf(" %d",uVar20);
                printf(" %d",(ulong)uVar8);
                printf(" %d");
                in_RSI = (xmlChar *)0x0;
                printf(" %d");
                putchar(10);
              }
            }
          }
          uVar20 = (ulong)(iVar3 + 1);
        }
        uVar21 = (ulong)(iVar2 + 1);
      }
      uVar19 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar1 = (int)uVar15, iVar1 != 5) {
      pxVar10 = (xmlChar *)0x0;
      while (iVar2 = (int)pxVar10, iVar2 != 4) {
        iVar3 = xmlMemBlocks();
        pxVar11 = gen_const_xmlChar_ptr(iVar1,(int)in_RSI);
        iVar17 = gen_int(iVar2,(int)in_RSI);
        if ((pxVar11 == (xmlChar *)0x0) ||
           (sVar12 = strlen((char *)pxVar11), iVar17 <= (int)sVar12 + 1)) {
          xmlSAX2CDataBlock(0,pxVar11,iVar17);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar17 = xmlMemBlocks();
          in_RSI = pxVar11;
          if (iVar3 != iVar17) {
            iVar17 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2CDataBlock",(ulong)(uint)(iVar17 - iVar3));
            local_64 = local_64 + 1;
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar15);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar10;
          }
        }
        pxVar10 = (xmlChar *)(ulong)(iVar2 + 1);
      }
      uVar15 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar1 = (int)uVar15, iVar1 != 5) {
      pxVar10 = (xmlChar *)0x0;
      while (iVar2 = (int)pxVar10, iVar2 != 4) {
        iVar3 = xmlMemBlocks();
        pxVar11 = gen_const_xmlChar_ptr(iVar1,(int)in_RSI);
        iVar17 = gen_int(iVar2,(int)in_RSI);
        if ((pxVar11 == (xmlChar *)0x0) ||
           (sVar12 = strlen((char *)pxVar11), iVar17 <= (int)sVar12 + 1)) {
          xmlSAX2Characters(0,pxVar11,iVar17);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar17 = xmlMemBlocks();
          in_RSI = pxVar11;
          if (iVar3 != iVar17) {
            iVar17 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2Characters",(ulong)(uint)(iVar17 - iVar3));
            local_68 = local_68 + 1;
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar15);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar10;
          }
        }
        pxVar10 = (xmlChar *)(ulong)(iVar2 + 1);
      }
      uVar15 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    pxVar10 = (xmlChar *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar10;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      in_RSI = gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlSAX2Comment();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2Comment",(ulong)(uint)(iVar1 - iVar3));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar8);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlChar *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_60 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar1 = (int)uVar15, iVar1 != 5) {
      for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
        bVar18 = true;
        while (iVar3 = (int)in_RSI, bVar18) {
          iVar17 = xmlMemBlocks();
          in_RSI = gen_const_xmlChar_ptr(iVar1,iVar3);
          iVar3 = gen_int(iVar2,iVar3);
          xmlSAX2ElementDecl(0,in_RSI,iVar3);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar17 == iVar3) break;
          iVar3 = xmlMemBlocks();
          bVar18 = false;
          printf("Leak of %d blocks found in xmlSAX2ElementDecl",(ulong)(uint)(iVar3 - iVar17));
          local_60 = local_60 + 1;
          printf(" %d",(ulong)uVar8);
          printf(" %d",uVar15);
          printf(" %d");
          in_RSI = (xmlChar *)0x0;
          printf(" %d");
          putchar(10);
        }
      }
      uVar15 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    iVar1 = xmlMemBlocks();
    xmlSAX2EndDocument();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2EndDocument",(ulong)(uint)(iVar2 - iVar1));
      test_ret_5 = test_ret_5 + 1;
      in_RSI = (xmlChar *)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (uVar15 = 0; (int)uVar15 != 2; uVar15 = (ulong)((int)uVar15 + 1)) {
    pxVar10 = (xmlChar *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar10;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      in_RSI = gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlSAX2EndElement();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2EndElement",(ulong)(uint)(iVar1 - iVar3));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",uVar15);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlChar *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_5c = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar1 = (int)uVar15, iVar1 != 5) {
      uVar19 = 0;
      while (iVar2 = (int)uVar19, iVar2 != 5) {
        pxVar10 = (xmlChar *)0x0;
        while( true ) {
          iVar17 = (int)in_RSI;
          iVar3 = (int)pxVar10;
          if (iVar3 == 5) break;
          iVar7 = xmlMemBlocks();
          in_RSI = gen_const_xmlChar_ptr(iVar1,iVar17);
          pxVar11 = gen_const_xmlChar_ptr(iVar2,iVar17);
          gen_const_xmlChar_ptr(iVar3,iVar17);
          xmlSAX2EndElementNs(0,in_RSI,pxVar11);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar17 = xmlMemBlocks();
          if (iVar7 != iVar17) {
            iVar17 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2EndElementNs",(ulong)(uint)(iVar17 - iVar7));
            local_5c = local_5c + 1;
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar15);
            printf(" %d",uVar19);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar10;
          }
          pxVar10 = (xmlChar *)(ulong)(iVar3 + 1);
        }
        uVar19 = (ulong)(iVar2 + 1);
      }
      uVar15 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
    for (iVar3 = 0; iVar3 != 5; iVar3 = iVar3 + 1) {
      for (iVar17 = 0; iVar17 != 4; iVar17 = iVar17 + 1) {
        for (uVar8 = 0; uVar8 != 5; uVar8 = uVar8 + 1) {
          for (uVar9 = 0; uVar9 != 5; uVar9 = uVar9 + 1) {
            pxVar10 = (xmlChar *)0x0;
            while( true ) {
              iVar7 = (int)in_RSI;
              iVar4 = (int)pxVar10;
              if (iVar4 == 2) break;
              iVar5 = xmlMemBlocks();
              in_RSI = gen_const_xmlChar_ptr(iVar3,iVar7);
              iVar6 = gen_int(iVar17,iVar7);
              pxVar11 = gen_const_xmlChar_ptr(uVar8,iVar7);
              pxVar13 = gen_const_xmlChar_ptr(uVar9,iVar7);
              xmlSAX2EntityDecl(0,in_RSI,iVar6,pxVar11,pxVar13);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar7 = xmlMemBlocks();
              if (iVar5 != iVar7) {
                iVar7 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSAX2EntityDecl",(ulong)(uint)(iVar7 - iVar5));
                iVar1 = iVar1 + 1;
                printf(" %d",iVar2);
                printf(" %d",iVar3);
                printf(" %d",iVar17);
                printf(" %d",(ulong)uVar8);
                printf(" %d",(ulong)uVar9);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar10;
              }
              pxVar10 = (xmlChar *)(ulong)(iVar4 + 1);
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  local_9c = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar2 = (int)uVar15, iVar2 != 5) {
      uVar19 = 0;
      while (iVar3 = (int)uVar19, iVar3 != 5) {
        pxVar10 = (xmlChar *)0x0;
        while( true ) {
          iVar7 = (int)in_RSI;
          iVar17 = (int)pxVar10;
          if (iVar17 == 5) break;
          iVar4 = xmlMemBlocks();
          in_RSI = gen_const_xmlChar_ptr(iVar2,iVar7);
          pxVar11 = gen_const_xmlChar_ptr(iVar3,iVar7);
          pxVar13 = gen_const_xmlChar_ptr(iVar17,iVar7);
          xmlSAX2ExternalSubset(0,in_RSI,pxVar11,pxVar13);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar4 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2ExternalSubset",(ulong)(uint)(iVar7 - iVar4));
            local_9c = local_9c + 1;
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar15);
            printf(" %d",uVar19);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar10;
          }
          pxVar10 = (xmlChar *)(ulong)(iVar17 + 1);
        }
        uVar19 = (ulong)(iVar3 + 1);
      }
      uVar15 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    iVar3 = xmlMemBlocks();
    xmlSAX2GetColumnNumber();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar3 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetColumnNumber",(ulong)(uint)(iVar17 - iVar3));
      iVar2 = iVar2 + 1;
      in_RSI = (xmlChar *)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    pxVar10 = (xmlChar *)0x0;
    while( true ) {
      iVar17 = (int)in_RSI;
      iVar7 = (int)pxVar10;
      if (iVar7 == 5) break;
      iVar4 = xmlMemBlocks();
      in_RSI = gen_const_xmlChar_ptr(iVar7,iVar17);
      pxVar14 = (xmlEntityPtr)xmlSAX2GetEntity(0);
      desret_xmlEntityPtr(pxVar14);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar4 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2GetEntity",(ulong)(uint)(iVar17 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar8);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlChar *)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_78 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    iVar17 = xmlMemBlocks();
    xmlSAX2GetLineNumber();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar17 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetLineNumber",(ulong)(uint)(iVar7 - iVar17));
      local_78 = local_78 + 1;
      in_RSI = (xmlChar *)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_94 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    pxVar10 = (xmlChar *)0x0;
    while( true ) {
      iVar17 = (int)in_RSI;
      iVar7 = (int)pxVar10;
      if (iVar7 == 5) break;
      iVar4 = xmlMemBlocks();
      in_RSI = gen_const_xmlChar_ptr(iVar7,iVar17);
      pxVar14 = (xmlEntityPtr)xmlSAX2GetParameterEntity(0);
      desret_xmlEntityPtr(pxVar14);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar4 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2GetParameterEntity",(ulong)(uint)(iVar17 - iVar4))
        ;
        local_94 = local_94 + 1;
        printf(" %d",(ulong)uVar8);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlChar *)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    iVar17 = xmlMemBlocks();
    xmlSAX2GetPublicId();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar17 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetPublicId",(ulong)(uint)(iVar7 - iVar17));
      test_ret_4 = test_ret_4 + 1;
      in_RSI = (xmlChar *)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_80 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    iVar17 = xmlMemBlocks();
    xmlSAX2GetSystemId();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar17 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetSystemId",(ulong)(uint)(iVar7 - iVar17));
      local_80 = local_80 + 1;
      in_RSI = (xmlChar *)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_34 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    iVar17 = xmlMemBlocks();
    xmlSAX2HasExternalSubset();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar17 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2HasExternalSubset",(ulong)(uint)(iVar7 - iVar17));
      local_34 = local_34 + 1;
      in_RSI = (xmlChar *)(ulong)uVar8;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  pxVar10 = (xmlChar *)0x0;
  while (iVar17 = (int)pxVar10, iVar17 != 2) {
    iVar7 = xmlMemBlocks();
    xmlSAX2HasInternalSubset();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar7 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2HasInternalSubset",(ulong)(uint)(iVar4 - iVar7));
      test_ret_2 = test_ret_2 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar10;
    }
    pxVar10 = (xmlChar *)(ulong)(iVar17 + 1);
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar7 = (int)uVar15, iVar7 != 5) {
      pxVar10 = (xmlChar *)0x0;
      while (iVar4 = (int)pxVar10, iVar4 != 4) {
        iVar5 = xmlMemBlocks();
        pxVar11 = gen_const_xmlChar_ptr(iVar7,(int)in_RSI);
        iVar6 = gen_int(iVar4,(int)in_RSI);
        if ((pxVar11 == (xmlChar *)0x0) ||
           (sVar12 = strlen((char *)pxVar11), iVar6 <= (int)sVar12 + 1)) {
          xmlSAX2IgnorableWhitespace(0,pxVar11,iVar6);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          in_RSI = pxVar11;
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2IgnorableWhitespace",
                   (ulong)(uint)(iVar6 - iVar5));
            iVar17 = iVar17 + 1;
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar15);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar10;
          }
        }
        pxVar10 = (xmlChar *)(ulong)(iVar4 + 1);
      }
      uVar15 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar18 = true;
  iVar7 = 0;
  while (bVar18) {
    pxVar10 = (xmlChar *)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar5 = (int)pxVar10;
      if (iVar5 == 4) break;
      iVar6 = xmlMemBlocks();
      uVar8 = gen_int(iVar5,iVar4);
      in_RSI = (xmlChar *)(ulong)uVar8;
      xmlSAX2InitDefaultSAXHandler();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar6 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2InitDefaultSAXHandler",
               (ulong)(uint)(iVar4 - iVar6));
        iVar7 = iVar7 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlChar *)(ulong)(iVar5 + 1);
    }
    bVar18 = false;
  }
  function_tests = function_tests + 1;
  local_94 = -(local_94 + test_ret_4 + local_80 + local_34 + test_ret_2 + iVar17 +
               iVar1 + local_9c + iVar2 + iVar3 + local_78 +
               local_60 + test_ret_5 + test_ret_1 + local_5c +
               local_64 + local_68 + test_ret + local_44 + local_98 + local_40 + local_3c + iVar7);
  bVar18 = true;
  while (bVar18) {
    iVar1 = xmlMemBlocks();
    xmlSAX2InitDocbDefaultSAXHandler(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar18 = false;
    printf("Leak of %d blocks found in xmlSAX2InitDocbDefaultSAXHandler");
    in_RSI = (xmlChar *)0x0;
    printf(" %d");
    putchar(10);
    local_94 = local_94 + -1;
  }
  function_tests = function_tests + 1;
  bVar18 = true;
  while (bVar18) {
    iVar1 = xmlMemBlocks();
    xmlSAX2InitHtmlDefaultSAXHandler(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 == iVar2) break;
    xmlMemBlocks();
    bVar18 = false;
    printf("Leak of %d blocks found in xmlSAX2InitHtmlDefaultSAXHandler");
    in_RSI = (xmlChar *)0x0;
    printf(" %d");
    putchar(10);
    local_94 = local_94 + -1;
  }
  function_tests = function_tests + 1;
  local_60 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar1 = (int)uVar15, iVar1 != 5) {
      uVar19 = 0;
      while (iVar2 = (int)uVar19, iVar2 != 5) {
        pxVar10 = (xmlChar *)0x0;
        while( true ) {
          iVar17 = (int)in_RSI;
          iVar3 = (int)pxVar10;
          if (iVar3 == 5) break;
          iVar7 = xmlMemBlocks();
          in_RSI = gen_const_xmlChar_ptr(iVar1,iVar17);
          pxVar11 = gen_const_xmlChar_ptr(iVar2,iVar17);
          gen_const_xmlChar_ptr(iVar3,iVar17);
          xmlSAX2InternalSubset(0,in_RSI,pxVar11);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar17 = xmlMemBlocks();
          if (iVar7 != iVar17) {
            iVar17 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2InternalSubset",(ulong)(uint)(iVar17 - iVar7))
            ;
            local_60 = local_60 + 1;
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar15);
            printf(" %d",uVar19);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar10;
          }
          pxVar10 = (xmlChar *)(ulong)(iVar3 + 1);
        }
        uVar19 = (ulong)(iVar2 + 1);
      }
      uVar15 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  pxVar10 = (xmlChar *)0x0;
  while (iVar1 = (int)pxVar10, iVar1 != 2) {
    iVar2 = xmlMemBlocks();
    xmlSAX2IsStandalone();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2IsStandalone",(ulong)(uint)(iVar3 - iVar2));
      test_ret_4 = test_ret_4 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar10;
    }
    pxVar10 = (xmlChar *)(ulong)(iVar1 + 1);
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar1 = (int)uVar15, iVar1 != 5) {
      uVar19 = 0;
      while (iVar2 = (int)uVar19, iVar2 != 5) {
        pxVar10 = (xmlChar *)0x0;
        while( true ) {
          iVar17 = (int)in_RSI;
          iVar3 = (int)pxVar10;
          if (iVar3 == 5) break;
          iVar7 = xmlMemBlocks();
          in_RSI = gen_const_xmlChar_ptr(iVar1,iVar17);
          pxVar11 = gen_const_xmlChar_ptr(iVar2,iVar17);
          gen_const_xmlChar_ptr(iVar3,iVar17);
          xmlSAX2NotationDecl(0,in_RSI,pxVar11);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar17 = xmlMemBlocks();
          if (iVar7 != iVar17) {
            iVar17 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2NotationDecl",(ulong)(uint)(iVar17 - iVar7));
            local_64 = local_64 + 1;
            printf(" %d",(ulong)uVar8);
            printf(" %d",uVar15);
            printf(" %d",uVar19);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar10;
          }
          pxVar10 = (xmlChar *)(ulong)(iVar3 + 1);
        }
        uVar19 = (ulong)(iVar2 + 1);
      }
      uVar15 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar1 = (int)uVar15, iVar1 != 5) {
      pxVar10 = (xmlChar *)0x0;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar3 = (int)pxVar10;
        if (iVar3 == 5) break;
        iVar17 = xmlMemBlocks();
        in_RSI = gen_const_xmlChar_ptr(iVar1,iVar2);
        pxVar11 = gen_const_xmlChar_ptr(iVar3,iVar2);
        xmlSAX2ProcessingInstruction(0,in_RSI,pxVar11);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar17 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ProcessingInstruction",
                 (ulong)(uint)(iVar2 - iVar17));
          local_68 = local_68 + 1;
          printf(" %d",(ulong)uVar8);
          printf(" %d",uVar15);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar10;
        }
        pxVar10 = (xmlChar *)(ulong)(iVar3 + 1);
      }
      uVar15 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    pxVar10 = (xmlChar *)0x0;
    while( true ) {
      iVar1 = (int)in_RSI;
      iVar2 = (int)pxVar10;
      if (iVar2 == 5) break;
      iVar3 = xmlMemBlocks();
      in_RSI = gen_const_xmlChar_ptr(iVar2,iVar1);
      xmlSAX2Reference();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2Reference",(ulong)(uint)(iVar1 - iVar3));
        test_ret_5 = test_ret_5 + 1;
        printf(" %d",(ulong)uVar8);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar10;
      }
      pxVar10 = (xmlChar *)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret = 0;
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    uVar15 = 0;
    while (iVar1 = (int)uVar15, iVar1 != 5) {
      pxVar10 = (xmlChar *)0x0;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar3 = (int)pxVar10;
        if (iVar3 == 5) break;
        iVar17 = xmlMemBlocks();
        in_RSI = gen_const_xmlChar_ptr(iVar1,iVar2);
        pxVar11 = gen_const_xmlChar_ptr(iVar3,iVar2);
        xmlSAX2ResolveEntity(0,in_RSI,pxVar11);
        xmlFreeInputStream();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar17 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ResolveEntity",(ulong)(uint)(iVar2 - iVar17));
          test_ret = test_ret + 1;
          printf(" %d",(ulong)uVar8);
          printf(" %d",uVar15);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar10;
        }
        pxVar10 = (xmlChar *)(ulong)(iVar3 + 1);
      }
      uVar15 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  local_78 = 0;
  do {
    if (iVar1 == 2) {
      function_tests = function_tests + 1;
      local_80 = 0;
      for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
        iVar1 = xmlMemBlocks();
        xmlSAX2StartDocument(0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2StartDocument",(ulong)(uint)(iVar2 - iVar1));
          local_80 = local_80 + 1;
          in_RSI = (xmlChar *)(ulong)uVar8;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      uVar15 = 0;
      test_ret_1 = 0;
      do {
        if ((int)uVar15 == 2) {
          function_tests = function_tests + 1;
          uVar15 = 0;
          local_5c = 0;
          do {
            if ((int)uVar15 == 2) {
              function_tests = function_tests + 1;
              iVar1 = 0;
              for (iVar2 = 0; iVar2 != 2; iVar2 = iVar2 + 1) {
                uVar15 = 0;
                while (iVar3 = (int)uVar15, iVar3 != 5) {
                  for (uVar8 = 0; uVar8 != 5; uVar8 = uVar8 + 1) {
                    for (uVar9 = 0; uVar9 != 5; uVar9 = uVar9 + 1) {
                      pxVar10 = (xmlChar *)0x0;
                      while( true ) {
                        iVar7 = (int)in_RSI;
                        iVar17 = (int)pxVar10;
                        if (iVar17 == 5) break;
                        iVar4 = xmlMemBlocks();
                        in_RSI = gen_const_xmlChar_ptr(iVar3,iVar7);
                        pxVar11 = gen_const_xmlChar_ptr(uVar8,iVar7);
                        pxVar13 = gen_const_xmlChar_ptr(uVar9,iVar7);
                        pxVar16 = gen_const_xmlChar_ptr(iVar17,iVar7);
                        xmlSAX2UnparsedEntityDecl(0,in_RSI,pxVar11,pxVar13,pxVar16);
                        call_tests = call_tests + 1;
                        xmlResetLastError();
                        iVar7 = xmlMemBlocks();
                        if (iVar4 != iVar7) {
                          iVar7 = xmlMemBlocks();
                          printf("Leak of %d blocks found in xmlSAX2UnparsedEntityDecl",
                                 (ulong)(uint)(iVar7 - iVar4));
                          iVar1 = iVar1 + 1;
                          printf(" %d",iVar2);
                          printf(" %d",uVar15);
                          printf(" %d",(ulong)uVar8);
                          printf(" %d",(ulong)uVar9);
                          printf(" %d");
                          putchar(10);
                          in_RSI = pxVar10;
                        }
                        pxVar10 = (xmlChar *)(ulong)(iVar17 + 1);
                      }
                    }
                  }
                  uVar15 = (ulong)(iVar3 + 1);
                }
              }
              function_tests = function_tests + 1;
              iVar2 = 0;
              for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
                iVar3 = xmlMemBlocks();
                iVar17 = gen_int(uVar8,(int)in_RSI);
                xmlSAXDefaultVersion(iVar17);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar17 = xmlMemBlocks();
                if (iVar3 != iVar17) {
                  iVar17 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlSAXDefaultVersion",
                         (ulong)(uint)(iVar17 - iVar3));
                  iVar2 = iVar2 + 1;
                  in_RSI = (xmlChar *)(ulong)uVar8;
                  printf(" %d");
                  putchar(10);
                }
              }
              function_tests = function_tests + 1;
              bVar18 = true;
              iVar3 = 0;
              while (bVar18) {
                for (uVar8 = 0; iVar17 = (int)in_RSI, uVar8 != 4; uVar8 = uVar8 + 1) {
                  iVar7 = xmlMemBlocks();
                  uVar9 = gen_int(uVar8,iVar17);
                  in_RSI = (xmlChar *)(ulong)uVar9;
                  xmlSAXVersion(0);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar17 = xmlMemBlocks();
                  if (iVar7 != iVar17) {
                    iVar17 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlSAXVersion",(ulong)(uint)(iVar17 - iVar7))
                    ;
                    iVar3 = iVar3 + 1;
                    printf(" %d",0);
                    in_RSI = (xmlChar *)(ulong)uVar8;
                    printf(" %d");
                    putchar(10);
                  }
                }
                bVar18 = false;
              }
              function_tests = function_tests + 1;
              iVar1 = iVar2 + iVar3 +
                      local_80 + test_ret_1 + local_5c + iVar1 +
                      test_ret_5 + test_ret + local_78 + local_64 + local_68 + local_60 + test_ret_4
              ;
              uVar8 = -(local_94 - iVar1);
              if (local_94 != iVar1) {
                printf("Module SAX2: %d errors\n",(ulong)uVar8);
              }
              return uVar8;
            }
            for (local_98 = 0; local_98 != 5; local_98 = local_98 + 1) {
              uVar19 = 0;
              while (iVar1 = (int)uVar19, iVar1 != 5) {
                uVar21 = 0;
                while (iVar2 = (int)uVar21, iVar2 != 5) {
                  uVar20 = 0;
                  while (iVar3 = (int)uVar20, iVar3 != 4) {
                    iVar17 = 1;
                    while (iVar17 != 0) {
                      for (uVar8 = 0; iVar17 = 0, uVar8 != 4; uVar8 = uVar8 + 1) {
                        for (; iVar17 != 4; iVar17 = iVar17 + 1) {
                          bVar18 = true;
                          while (iVar7 = (int)in_RSI, bVar18) {
                            iVar4 = xmlMemBlocks();
                            in_RSI = gen_const_xmlChar_ptr(local_98,iVar7);
                            pxVar10 = gen_const_xmlChar_ptr(iVar1,iVar7);
                            pxVar11 = gen_const_xmlChar_ptr(iVar2,iVar7);
                            iVar5 = gen_int(iVar3,iVar7);
                            iVar6 = gen_int(uVar8,iVar7);
                            iVar7 = gen_int(iVar17,iVar7);
                            xmlSAX2StartElementNs(0,in_RSI,pxVar10,pxVar11,iVar5,0,iVar6,iVar7,0);
                            call_tests = call_tests + 1;
                            xmlResetLastError();
                            iVar7 = xmlMemBlocks();
                            if (iVar4 == iVar7) break;
                            iVar7 = xmlMemBlocks();
                            bVar18 = false;
                            printf("Leak of %d blocks found in xmlSAX2StartElementNs",
                                   (ulong)(uint)(iVar7 - iVar4));
                            local_5c = local_5c + 1;
                            printf(" %d",uVar15);
                            printf(" %d",(ulong)local_98);
                            printf(" %d",uVar19);
                            printf(" %d",uVar21);
                            printf(" %d",uVar20);
                            printf(" %d",0);
                            printf(" %d",(ulong)uVar8);
                            printf(" %d");
                            in_RSI = (xmlChar *)0x0;
                            printf(" %d");
                            putchar(10);
                          }
                        }
                      }
                    }
                    uVar20 = (ulong)(iVar3 + 1);
                  }
                  uVar21 = (ulong)(iVar2 + 1);
                }
                uVar19 = (ulong)(iVar1 + 1);
              }
            }
            uVar15 = (ulong)((int)uVar15 + 1);
          } while( true );
        }
        for (iVar1 = 0; iVar1 != 5; iVar1 = iVar1 + 1) {
          bVar18 = true;
          while (iVar2 = (int)in_RSI, bVar18) {
            iVar3 = xmlMemBlocks();
            in_RSI = gen_const_xmlChar_ptr(iVar1,iVar2);
            xmlSAX2StartElement(0,in_RSI,0);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar3 == iVar2) break;
            iVar2 = xmlMemBlocks();
            bVar18 = false;
            printf("Leak of %d blocks found in xmlSAX2StartElement",(ulong)(uint)(iVar2 - iVar3));
            test_ret_1 = test_ret_1 + 1;
            printf(" %d",uVar15);
            printf(" %d");
            in_RSI = (xmlChar *)0x0;
            printf(" %d");
            putchar(10);
          }
        }
        uVar15 = (ulong)((int)uVar15 + 1);
      } while( true );
    }
    bVar18 = true;
    while (bVar18) {
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlChar *)0x0;
      xmlSAX2SetDocumentLocator();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 == iVar3) break;
      iVar3 = xmlMemBlocks();
      bVar18 = false;
      printf("Leak of %d blocks found in xmlSAX2SetDocumentLocator",(ulong)(uint)(iVar3 - iVar2));
      local_78 = local_78 + 1;
      printf(" %d");
      in_RSI = (xmlChar *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

static int
test_SAX2(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing SAX2 : 38 of 38 functions ...\n");
    test_ret += test_docbDefaultSAXHandlerInit();
    test_ret += test_htmlDefaultSAXHandlerInit();
    test_ret += test_xmlDefaultSAXHandlerInit();
    test_ret += test_xmlSAX2AttributeDecl();
    test_ret += test_xmlSAX2CDataBlock();
    test_ret += test_xmlSAX2Characters();
    test_ret += test_xmlSAX2Comment();
    test_ret += test_xmlSAX2ElementDecl();
    test_ret += test_xmlSAX2EndDocument();
    test_ret += test_xmlSAX2EndElement();
    test_ret += test_xmlSAX2EndElementNs();
    test_ret += test_xmlSAX2EntityDecl();
    test_ret += test_xmlSAX2ExternalSubset();
    test_ret += test_xmlSAX2GetColumnNumber();
    test_ret += test_xmlSAX2GetEntity();
    test_ret += test_xmlSAX2GetLineNumber();
    test_ret += test_xmlSAX2GetParameterEntity();
    test_ret += test_xmlSAX2GetPublicId();
    test_ret += test_xmlSAX2GetSystemId();
    test_ret += test_xmlSAX2HasExternalSubset();
    test_ret += test_xmlSAX2HasInternalSubset();
    test_ret += test_xmlSAX2IgnorableWhitespace();
    test_ret += test_xmlSAX2InitDefaultSAXHandler();
    test_ret += test_xmlSAX2InitDocbDefaultSAXHandler();
    test_ret += test_xmlSAX2InitHtmlDefaultSAXHandler();
    test_ret += test_xmlSAX2InternalSubset();
    test_ret += test_xmlSAX2IsStandalone();
    test_ret += test_xmlSAX2NotationDecl();
    test_ret += test_xmlSAX2ProcessingInstruction();
    test_ret += test_xmlSAX2Reference();
    test_ret += test_xmlSAX2ResolveEntity();
    test_ret += test_xmlSAX2SetDocumentLocator();
    test_ret += test_xmlSAX2StartDocument();
    test_ret += test_xmlSAX2StartElement();
    test_ret += test_xmlSAX2StartElementNs();
    test_ret += test_xmlSAX2UnparsedEntityDecl();
    test_ret += test_xmlSAXDefaultVersion();
    test_ret += test_xmlSAXVersion();

    if (test_ret != 0)
	printf("Module SAX2: %d errors\n", test_ret);
    return(test_ret);
}